

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

Complex __thiscall rtb::Filter::Polynomial<double>::solveFor(Polynomial<double> *this,Complex value)

{
  ulong __n;
  const_reference __x;
  undefined8 uVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  complex<double> cVar3;
  Complex CVar4;
  uint local_5c;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  complex<double> local_38;
  
  uVar1 = value._M_value._8_8_;
  local_50 = 0.0;
  dVar2 = 0.0;
  __n = 0;
  while (local_5c = (uint)__n, __n < this->size_) {
    local_58 = dVar2;
    __x = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                    (&this->coefficients_,__n);
    std::pow<double,unsigned_int>(&local_38,&local_5c);
    local_48._8_8_ = dVar2;
    cVar3 = std::operator*(__x,(complex<double> *)local_48);
    uVar1 = cVar3._M_value._8_8_;
    local_50 = local_50 + extraout_XMM0_Qa;
    dVar2 = local_58 + dVar2;
    __n = (ulong)(local_5c + 1);
  }
  CVar4._M_value._8_8_ = uVar1;
  CVar4._M_value._0_8_ = __n;
  return (Complex)CVar4._M_value;
}

Assistant:

typename Polynomial<T>::Complex Polynomial<T>::solveFor(Complex value) const {

            Complex r{ 0 };
            for (unsigned i{ 0 }; i < size_; ++i)
                r += coefficients_.at(i)*std::pow(value, i);
            return r;
        }